

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

int mu_button_ex(mu_Context *ctx,char *label,int icon,int opt)

{
  size_t sVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  mu_Id id;
  mu_Rect rect;
  int local_34;
  
  local_34 = icon;
  if (label == (char *)0x0) {
    iVar4 = (ctx->id_stack).idx;
    if (iVar4 < 1) {
      id = 0x811c9dc5;
    }
    else {
      id = (ctx->id_stack).items[iVar4 - 1];
    }
    lVar3 = 0;
    do {
      id = (*(byte *)((long)&local_34 + lVar3) ^ id) * 0x1000193;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 4);
  }
  else {
    sVar1 = strlen(label);
    iVar4 = (ctx->id_stack).idx;
    if (iVar4 < 1) {
      id = 0x811c9dc5;
    }
    else {
      id = (ctx->id_stack).items[iVar4 - 1];
    }
    if ((int)sVar1 != 0) {
      lVar3 = 0;
      do {
        id = ((byte)label[lVar3] ^ id) * 0x1000193;
        lVar3 = lVar3 + 1;
      } while ((int)sVar1 != (int)lVar3);
    }
  }
  ctx->last_id = id;
  rect = mu_layout_next(ctx);
  mu_update_control(ctx,id,rect,opt);
  iVar4 = 0;
  if (ctx->mouse_pressed == 1) {
    iVar4 = (uint)(ctx->focus == id) * 2;
  }
  if ((opt & 8U) == 0) {
    uVar2 = 8;
    if (ctx->focus != id) {
      uVar2 = ctx->hover == id | 6;
    }
    (*ctx->draw_frame)(ctx,rect,uVar2);
  }
  if (label != (char *)0x0) {
    mu_draw_control_text(ctx,label,rect,0,opt);
  }
  if (icon != 0) {
    mu_draw_icon(ctx,icon,rect,ctx->style->colors[0]);
  }
  return iVar4;
}

Assistant:

int mu_button_ex(mu_Context *ctx, const char *label, int icon, int opt) {
  int res = 0;
  mu_Id id = label ? mu_get_id(ctx, label, strlen(label))
                   : mu_get_id(ctx, &icon, sizeof(icon));
  mu_Rect r = mu_layout_next(ctx);
  mu_update_control(ctx, id, r, opt);
  /* handle click */
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->focus == id) {
    res |= MU_RES_SUBMIT;
  }
  /* draw */
  mu_draw_control_frame(ctx, id, r, MU_COLOR_BUTTON, opt);
  if (label) { mu_draw_control_text(ctx, label, r, MU_COLOR_TEXT, opt); }
  if (icon) { mu_draw_icon(ctx, icon, r, ctx->style->colors[MU_COLOR_TEXT]); }
  return res;
}